

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_unused_interface_variables_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::RemoveUnusedInterfaceVariablesContext::Modify
          (RemoveUnusedInterfaceVariablesContext *this)

{
  pointer puVar1;
  Instruction *pIVar2;
  uint32_t index;
  pointer puVar3;
  initializer_list<unsigned_int> init_list;
  uint local_8c;
  Operand local_88;
  SmallVector<unsigned_int,_2UL> local_58;
  
  index = Instruction::NumInOperands(this->entry_);
  while (index = index - 1, 2 < (int)index) {
    Instruction::RemoveInOperand(this->entry_,index);
  }
  puVar1 = (this->operands_to_add_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->operands_to_add_).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    local_8c = *puVar3;
    pIVar2 = this->entry_;
    init_list._M_len = 1;
    init_list._M_array = &local_8c;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
    local_88.type = SPV_OPERAND_TYPE_ID;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&pIVar2->operands_,&local_88);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  }
  return;
}

Assistant:

void Modify() {
    for (int i = entry_.NumInOperands() - 1; i >= 3; --i)
      entry_.RemoveInOperand(i);
    for (auto id : operands_to_add_) {
      entry_.AddOperand(Operand(SPV_OPERAND_TYPE_ID, {id}));
    }
  }